

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O3

string * __thiscall
argParserAdvancedConfiguration::generateAutoCompletion_abi_cxx11_
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this)

{
  argument *paVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  pointer ppsVar5;
  undefined8 uVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  pointer ppsVar10;
  pointer ppaVar11;
  ulong uVar12;
  ulong uVar13;
  string topLevelArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  long local_e0;
  undefined1 local_d8 [32];
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  argParserAdvancedConfiguration *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_d8._16_8_ = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"#/usr/bin/env bash\n_function()\n{\n\n","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  ppsVar5 = (this->newargconfig->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppsVar10 = (this->newargconfig->
             super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  if (ppsVar10 != ppsVar5) {
    uVar13 = 0;
    do {
      if ((ulong)((long)ppsVar10 - (long)ppsVar5 >> 3) <= uVar13) {
LAB_0010aa35:
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar13);
        if (local_e8 != &local_50) {
          operator_delete(local_e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._24_8_ != &local_b0) {
          operator_delete((void *)local_d8._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(undefined1 **)local_d8._16_8_ != local_80) {
          operator_delete(*(undefined1 **)local_d8._16_8_);
        }
        _Unwind_Resume(uVar6);
      }
      ppaVar11 = (ppsVar5[uVar13]->arguments->
                 super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((ppsVar5[uVar13]->arguments->
          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppaVar11) {
        uVar12 = 0;
        do {
          paVar1 = ppaVar11[uVar12];
          local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
          pcVar2 = (paVar1->argLong)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,pcVar2,pcVar2 + (paVar1->argLong)._M_string_length);
          std::__cxx11::string::append((char *)&local_e8);
          std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_e8);
          if (local_e8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
            operator_delete(local_e8);
          }
          std::operator+(&local_50,"if [ \"${COMP_WORDS[${COMP_CWORD} -1 ]}\" == \"",
                         &paVar1->argLong);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_a0 = &local_90;
          plVar7 = plVar3 + 2;
          if ((long *)*plVar3 == plVar7) {
            local_90 = *plVar7;
            lStack_88 = plVar3[3];
          }
          else {
            local_90 = *plVar7;
            local_a0 = (long *)*plVar3;
          }
          local_98 = plVar3[1];
          *plVar3 = (long)plVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a0,(ulong)(paVar1->argShort)._M_dataplus._M_p);
          local_d8._24_8_ = &local_b0;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar8) {
            local_b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_b0._8_8_ = plVar3[3];
          }
          else {
            local_b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_d8._24_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar3;
          }
          local_b8 = plVar3[1];
          *plVar3 = (long)paVar8;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append(local_d8 + 0x18);
          local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar4 + 2)
          ;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4 == pbVar9
             ) {
            local_d8._0_8_ = (pbVar9->_M_dataplus)._M_p;
            local_d8._8_8_ = puVar4[3];
          }
          else {
            local_d8._0_8_ = (pbVar9->_M_dataplus)._M_p;
            local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4;
          }
          local_e0 = puVar4[1];
          *puVar4 = pbVar9;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_d8._16_8_,(ulong)local_e8);
          if (local_e8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
            operator_delete(local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._24_8_ != &local_b0) {
            operator_delete((void *)local_d8._24_8_);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (paVar1->enumIsFile == true) {
            std::__cxx11::string::append((char *)local_d8._16_8_);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_d8 + 0x18),"     COMPREPLY=($(compgen -W \"",&paVar1->enums);
            puVar4 = (undefined8 *)std::__cxx11::string::append((char *)(local_d8 + 0x18));
            local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
            ;
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (puVar4 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4 ==
                pbVar9) {
              local_d8._0_8_ = (pbVar9->_M_dataplus)._M_p;
              local_d8._8_8_ = puVar4[3];
            }
            else {
              local_d8._0_8_ = (pbVar9->_M_dataplus)._M_p;
              local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *puVar4;
            }
            local_e0 = puVar4[1];
            *puVar4 = pbVar9;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_d8._16_8_,(ulong)local_e8);
            if (local_e8 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
              operator_delete(local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._24_8_ != &local_b0) {
              operator_delete((void *)local_d8._24_8_);
            }
          }
          std::__cxx11::string::append((char *)local_d8._16_8_);
          ppsVar5 = (local_78->newargconfig->
                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ppsVar10 = (local_78->newargconfig->
                     super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          if ((ulong)((long)ppsVar10 - (long)ppsVar5 >> 3) <= uVar13) goto LAB_0010aa35;
          uVar12 = uVar12 + 1;
          ppaVar11 = (ppsVar5[uVar13]->arguments->
                     super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(ppsVar5[uVar13]->arguments->
                                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar11
                                 >> 3));
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)ppsVar10 - (long)ppsVar5 >> 3));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d8 + 0x18),"se\n     COMPREPLY=($(compgen -W \"",&local_70);
  plVar3 = (long *)std::__cxx11::string::append(local_d8 + 0x18);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar9) {
    local_d8._0_8_ = (pbVar9->_M_dataplus)._M_p;
    local_d8._8_8_ = plVar3[3];
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  }
  else {
    local_d8._0_8_ = (pbVar9->_M_dataplus)._M_p;
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3;
  }
  local_e0 = plVar3[1];
  *plVar3 = (long)pbVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_d8._16_8_,(ulong)local_e8);
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
    operator_delete(local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._24_8_ != &local_b0) {
    operator_delete((void *)local_d8._24_8_);
  }
  uVar6 = local_d8._16_8_;
  std::__cxx11::string::append((char *)local_d8._16_8_);
  std::__cxx11::string::append((char *)uVar6);
  std::__cxx11::string::_M_assign((string *)&autoCompletionScript_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return (string *)local_d8._16_8_;
}

Assistant:

string argParserAdvancedConfiguration::generateAutoCompletion() {

    string script = "#/usr/bin/env bash\n_function()\n{\n\n";
    argument * arg;
    string topLevelArgs;
    for (int i = 0; i < newargconfig->size(); i++) {
        for(int y = 0; y<newargconfig->at(i)->arguments->size();y++){
            arg = newargconfig->at(i)->arguments->at(y);
            topLevelArgs += arg->argLong + " ";
            script += R"(if [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argLong +
                      R"(" ] || [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argShort +
                      "\" ]; then\n";
            if (arg->enumIsFile) {
                script += "    compopt -o nospace -o dirnames -o filenames\n"
                          "    COMPREPLY=($(compgen  -f \"${COMP_WORDS[${COMP_CWORD}]}\"))      \n";
            } else {
                script += "     COMPREPLY=($(compgen -W \"" + arg->enums +
                          "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
            }
            script += "\n   el";
        }
    }


    script += "se\n     COMPREPLY=($(compgen -W \"" + topLevelArgs + "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
    script += "  fi\n compgen -o bashdefault\n}\n";
    script += "complete -F _function ";
    autoCompletionScript = script;
    return script;

}